

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawElementsBaseVertexTests.cpp
# Opt level: O0

IterateResult __thiscall
glcts::DrawElementsBaseVertexNegativeMappedBufferObjectsTest::iterate
          (DrawElementsBaseVertexNegativeMappedBufferObjectsTest *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  TestError *pTVar8;
  char *pcVar9;
  string local_a70;
  MessageBuilder local_a50;
  string local_8d0;
  stringstream local_8b0 [8];
  stringstream error_sstream_2;
  ostream local_8a0;
  undefined1 local_721;
  string local_700;
  MessageBuilder local_6e0;
  string local_560;
  stringstream local_540 [8];
  stringstream error_sstream_1;
  ostream local_530;
  undefined1 local_3b1;
  string local_390;
  MessageBuilder local_370;
  string local_1f0;
  stringstream local_1c0 [8];
  stringstream error_sstream;
  ostream local_1b0;
  uint local_34;
  undefined8 uStack_30;
  GLenum error_code;
  GLvoid *bo_ptr;
  byte local_1e;
  byte local_1d;
  uint local_1c;
  bool use_clientside_vertex_data;
  bool use_clientside_index_data;
  long lStack_18;
  int iteration;
  Functions *gl;
  DrawElementsBaseVertexNegativeMappedBufferObjectsTest *this_local;
  
  gl = (Functions *)this;
  pRVar4 = deqp::Context::getRenderContext
                     ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar2);
  local_1c = 0;
  do {
    if (3 < (int)local_1c) {
      tcu::TestContext::setTestResult
                ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.super_TestCase.
                 super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    local_1d = (local_1c & 1) != 0;
    local_1e = (local_1c & 2) != 0;
    pRVar4 = deqp::Context::getRenderContext
                       ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.m_context);
    bo_ptr._4_4_ = (*pRVar4->_vptr_RenderContext[2])();
    bVar1 = glu::isContextTypeES((ContextType)bo_ptr._4_4_);
    if (((bVar1) || (((local_1d & 1) == 0 && ((local_1e & 1) == 0)))) && ((local_1e & 1) == 0)) {
      DrawElementsBaseVertexTestBase::setUpNegativeTestObjects
                (&this->super_DrawElementsBaseVertexTestBase,(bool)(local_1e & 1),
                 (bool)(local_1d & 1));
      uStack_30 = (**(code **)(lStack_18 + 0xd00))
                            (0x8892,0,(this->super_DrawElementsBaseVertexTestBase).
                                      m_bo_negative_data_vertex_size,1);
      dVar3 = (**(code **)(lStack_18 + 0x800))();
      glu::checkError(dVar3,"glMapBufferRange() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                      ,0xd0c);
      local_34 = 0;
      (**(code **)(lStack_18 + 0x570))
                (4,3,0x1405,(this->super_DrawElementsBaseVertexTestBase).m_draw_call_index_offset,0)
      ;
      local_34 = (**(code **)(lStack_18 + 0x800))();
      if (local_34 != 0x502) {
        std::__cxx11::stringstream::stringstream(local_1c0);
        poVar5 = std::operator<<(&local_1b0,"Invalid error code generated by ");
        DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
                  (&local_1f0,&this->super_DrawElementsBaseVertexTestBase,
                   FUNCTION_GL_DRAW_ELEMENTS_BASE_VERTEX);
        std::operator<<(poVar5,(string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        pTVar6 = tcu::TestContext::getLog
                           ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.
                            super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_370,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
                  (&local_390,&this->super_DrawElementsBaseVertexTestBase,
                   FUNCTION_GL_DRAW_ELEMENTS_BASE_VERTEX);
        pMVar7 = tcu::MessageBuilder::operator<<(&local_370,&local_390);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [23])" returned error code [");
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_34);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (pMVar7,(char (*) [35])"] instead of GL_INVALID_OPERATION.");
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_390);
        tcu::MessageBuilder::~MessageBuilder(&local_370);
        local_3b1 = 1;
        pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        tcu::TestError::TestError
                  (pTVar8,pcVar9,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                   ,0xd22);
        local_3b1 = 0;
        __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      (**(code **)(lStack_18 + 0x590))
                (4,3,0x1405,(this->super_DrawElementsBaseVertexTestBase).m_draw_call_index_offset,1,
                 0);
      local_34 = (**(code **)(lStack_18 + 0x800))();
      if (local_34 != 0x502) {
        std::__cxx11::stringstream::stringstream(local_540);
        poVar5 = std::operator<<(&local_530,"Invalid error code generated by ");
        DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
                  (&local_560,&this->super_DrawElementsBaseVertexTestBase,
                   FUNCTION_GL_DRAW_ELEMENTS_INSTANCED_BASE_VERTEX);
        std::operator<<(poVar5,(string *)&local_560);
        std::__cxx11::string::~string((string *)&local_560);
        pTVar6 = tcu::TestContext::getLog
                           ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.
                            super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_6e0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
                  (&local_700,&this->super_DrawElementsBaseVertexTestBase,
                   FUNCTION_GL_DRAW_ELEMENTS_INSTANCED_BASE_VERTEX);
        pMVar7 = tcu::MessageBuilder::operator<<(&local_6e0,&local_700);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [23])" returned error code [");
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_34);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (pMVar7,(char (*) [35])"] instead of GL_INVALID_OPERATION.");
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_700);
        tcu::MessageBuilder::~MessageBuilder(&local_6e0);
        local_721 = 1;
        pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        tcu::TestError::TestError
                  (pTVar8,pcVar9,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                   ,0xd36);
        local_721 = 0;
        __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      (**(code **)(lStack_18 + 0x5a8))
                (4,0,2,3,0x1405,
                 (this->super_DrawElementsBaseVertexTestBase).m_draw_call_index_offset,0);
      local_34 = (**(code **)(lStack_18 + 0x800))();
      if (local_34 != 0x502) {
        std::__cxx11::stringstream::stringstream(local_8b0);
        poVar5 = std::operator<<(&local_8a0,"Invalid error code generated by ");
        DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
                  (&local_8d0,&this->super_DrawElementsBaseVertexTestBase,
                   FUNCTION_GL_DRAW_RANGE_ELEMENTS_BASE_VERTEX);
        std::operator<<(poVar5,(string *)&local_8d0);
        std::__cxx11::string::~string((string *)&local_8d0);
        pTVar6 = tcu::TestContext::getLog
                           ((this->super_DrawElementsBaseVertexTestBase).super_TestCaseBase.
                            super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_a50,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        DrawElementsBaseVertexTestBase::getFunctionName_abi_cxx11_
                  (&local_a70,&this->super_DrawElementsBaseVertexTestBase,
                   FUNCTION_GL_DRAW_RANGE_ELEMENTS_BASE_VERTEX);
        pMVar7 = tcu::MessageBuilder::operator<<(&local_a50,&local_a70);
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [23])" returned error code [");
        pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_34);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (pMVar7,(char (*) [35])"] instead of GL_INVALID_OPERATION.");
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_a70);
        tcu::MessageBuilder::~MessageBuilder(&local_a50);
        pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        tcu::TestError::TestError
                  (pTVar8,pcVar9,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                   ,0xd49);
        __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      (**(code **)(lStack_18 + 0x1670))(0x8892);
      dVar3 = (**(code **)(lStack_18 + 0x800))();
      glu::checkError(dVar3,"glUnmapBuffer() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/draw_elements_base_vertex/esextcDrawElementsBaseVertexTests.cpp"
                      ,0xd4e);
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult DrawElementsBaseVertexNegativeMappedBufferObjectsTest::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* The test needs to be run in four iterations, where for each iteration we configure the VAO
	 * in a slightly different manner.
	 */
	for (int iteration = 0; iteration < 4; ++iteration)
	{
		bool use_clientside_index_data  = ((iteration & (1 << 0)) != 0);
		bool use_clientside_vertex_data = ((iteration & (1 << 1)) != 0);

		/* OpenGL does not support client-side data. */
		if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
		{
			if (use_clientside_index_data || use_clientside_vertex_data)
			{
				continue;
			}
		}

		/* Skip the iteration where no array buffer is used */
		if (use_clientside_vertex_data)
		{
			continue;
		}

		/* Set up the work environment */
		setUpNegativeTestObjects(use_clientside_vertex_data, use_clientside_index_data);

		/* Map the buffer object into process space */
		const glw::GLvoid* bo_ptr = gl.mapBufferRange(GL_ARRAY_BUFFER, 0, /* offset */
													  m_bo_negative_data_vertex_size, GL_MAP_READ_BIT);
		(void)bo_ptr;
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed.");

		/* Perform draw calls that would otherwise have been valid, if it
		 * were not for the mapped VBO
		 */
		glw::GLenum error_code = GL_NONE;

		gl.drawElementsBaseVertex(GL_TRIANGLES, 3,								 /* count */
								  GL_UNSIGNED_INT, m_draw_call_index_offset, 0); /* basevertex */

		error_code = gl.getError();
		if (error_code != GL_INVALID_OPERATION)
		{
			std::stringstream error_sstream;

			error_sstream << "Invalid error code generated by "
						  << getFunctionName(FUNCTION_GL_DRAW_ELEMENTS_BASE_VERTEX);

			m_testCtx.getLog() << tcu::TestLog::Message << getFunctionName(FUNCTION_GL_DRAW_ELEMENTS_BASE_VERTEX)
							   << " returned error code [" << error_code << "] instead of GL_INVALID_OPERATION."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL(error_sstream.str().c_str());
		} /* if (error_code != GL_INVALID_OPERATION) */

		gl.drawElementsInstancedBaseVertex(GL_TRIANGLES, 3,								 /* count */
										   GL_UNSIGNED_INT, m_draw_call_index_offset, 1, /* instancecount */
										   0);											 /* basevertex */

		error_code = gl.getError();
		if (error_code != GL_INVALID_OPERATION)
		{
			std::stringstream error_sstream;

			error_sstream << "Invalid error code generated by "
						  << getFunctionName(FUNCTION_GL_DRAW_ELEMENTS_INSTANCED_BASE_VERTEX);

			m_testCtx.getLog() << tcu::TestLog::Message
							   << getFunctionName(FUNCTION_GL_DRAW_ELEMENTS_INSTANCED_BASE_VERTEX)
							   << " returned error code [" << error_code << "] instead of GL_INVALID_OPERATION."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL(error_sstream.str().c_str());
		}

		gl.drawRangeElementsBaseVertex(GL_TRIANGLES, 0, 2,							  /* end */
									   3,											  /* count */
									   GL_UNSIGNED_INT, m_draw_call_index_offset, 0); /* basevertex */

		error_code = gl.getError();
		if (error_code != GL_INVALID_OPERATION)
		{
			std::stringstream error_sstream;

			error_sstream << "Invalid error code generated by "
						  << getFunctionName(FUNCTION_GL_DRAW_RANGE_ELEMENTS_BASE_VERTEX);

			m_testCtx.getLog() << tcu::TestLog::Message << getFunctionName(FUNCTION_GL_DRAW_RANGE_ELEMENTS_BASE_VERTEX)
							   << " returned error code [" << error_code << "] instead of GL_INVALID_OPERATION."
							   << tcu::TestLog::EndMessage;

			TCU_FAIL(error_sstream.str().c_str());
		}

		/* Unmap the BO before we proceed */
		gl.unmapBuffer(GL_ARRAY_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed");

	} /* for (all test iterations) */

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}